

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  if (1 < current->_M_string_length) {
    pcVar2 = (current->_M_dataplus)._M_p;
    if ((*pcVar2 == '/') && (bVar1 = pcVar2[1], 0x21 < bVar1 && bVar1 != 0x2d)) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (current,':',0);
      if (sVar4 == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&bStack_48,current,1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&bStack_48);
        ::std::__cxx11::string::~string((string *)&bStack_48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (value,"");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&bStack_48,current,1,sVar4 - 1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&bStack_48);
        ::std::__cxx11::string::~string((string *)&bStack_48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&bStack_48,current,sVar4 + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value,&bStack_48);
        ::std::__cxx11::string::~string((string *)&bStack_48);
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}